

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::PopStyleVar(int count)

{
  ImGuiStyleMod *pIVar1;
  ImGuiContext *pIVar2;
  int iVar3;
  ulong uVar4;
  int iVar5;
  
  pIVar2 = GImGui;
  iVar3 = (GImGui->StyleVarStack).Size;
  if (iVar3 < count) {
    count = iVar3;
  }
  if (0 < count) {
    iVar5 = count + 1;
    do {
      pIVar1 = (pIVar2->StyleVarStack).Data;
      uVar4 = (ulong)GStyleVarInfo[pIVar1[(long)iVar3 + -1].VarIdx].Offset;
      if (GStyleVarInfo[pIVar1[(long)iVar3 + -1].VarIdx].Count == 2) {
        *(int *)((long)&(pIVar2->Style).Alpha + uVar4) =
             pIVar1[(long)iVar3 + -1].field_1.BackupInt[0];
        *(int *)((long)&(pIVar2->Style).DisabledAlpha + uVar4) =
             pIVar1[(long)iVar3 + -1].field_1.BackupInt[1];
      }
      else if (GStyleVarInfo[pIVar1[(long)iVar3 + -1].VarIdx].Count == 1) {
        *(int *)((long)&(pIVar2->Style).Alpha + uVar4) =
             pIVar1[(long)iVar3 + -1].field_1.BackupInt[0];
      }
      iVar3 = (pIVar2->StyleVarStack).Size + -1;
      (pIVar2->StyleVarStack).Size = iVar3;
      iVar5 = iVar5 + -1;
    } while (1 < iVar5);
  }
  return;
}

Assistant:

void ImGui::PopStyleVar(int count)
{
    ImGuiContext& g = *GImGui;
    if (g.StyleVarStack.Size < count)
    {
        IM_ASSERT_USER_ERROR(g.StyleVarStack.Size > count, "Calling PopStyleVar() too many times: stack underflow.");
        count = g.StyleVarStack.Size;
    }
    while (count > 0)
    {
        // We avoid a generic memcpy(data, &backup.Backup.., GDataTypeSize[info->Type] * info->Count), the overhead in Debug is not worth it.
        ImGuiStyleMod& backup = g.StyleVarStack.back();
        const ImGuiStyleVarInfo* info = GetStyleVarInfo(backup.VarIdx);
        void* data = info->GetVarPtr(&g.Style);
        if (info->Type == ImGuiDataType_Float && info->Count == 1)      { ((float*)data)[0] = backup.BackupFloat[0]; }
        else if (info->Type == ImGuiDataType_Float && info->Count == 2) { ((float*)data)[0] = backup.BackupFloat[0]; ((float*)data)[1] = backup.BackupFloat[1]; }
        g.StyleVarStack.pop_back();
        count--;
    }
}